

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_loader.cpp
# Opt level: O1

avector<AffineSpace3ff> * __thiscall
embree::XMLLoader::loadQuaternionArray
          (avector<AffineSpace3ff> *__return_storage_ptr__,XMLLoader *this,Ref<embree::XML> *xml)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  Vector *pVVar3;
  undefined8 uVar4;
  int iVar5;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *pAVar6;
  long lVar7;
  runtime_error *this_00;
  long *plVar8;
  ulong uVar9;
  anon_union_16_2_47237d3f_for_Vec3fx_0 *paVar10;
  ulong uVar11;
  AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *ptr;
  XMLLoader *this_01;
  ulong uVar12;
  Ref<embree::XML> child;
  string local_d8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_b8;
  anon_union_16_2_47237d3f_for_Vec3fx_0 local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  _Base_ptr local_88;
  _Base_ptr p_Stack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  _Base_ptr local_68;
  size_t sStack_60;
  pointer local_58;
  pointer pRStack_50;
  pointer local_48;
  pointer pTStack_40;
  
  if (xml->ptr == (XML *)0x0) {
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
  }
  else {
    iVar5 = std::__cxx11::string::compare((char *)&xml->ptr->name);
    if (iVar5 != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      ParseLocation::str_abi_cxx11_(&local_d8,&xml->ptr->loc);
      plVar8 = (long *)std::__cxx11::string::append((char *)&local_d8);
      local_b8._0_8_ = *plVar8;
      paVar10 = (anon_union_16_2_47237d3f_for_Vec3fx_0 *)(plVar8 + 2);
      if ((anon_union_16_2_47237d3f_for_Vec3fx_0 *)local_b8._0_8_ == paVar10) {
        local_a8._0_8_ = *(undefined8 *)paVar10;
        local_a8._8_8_ = plVar8[3];
        local_b8._0_8_ = &local_a8;
      }
      else {
        local_a8._0_8_ = *(undefined8 *)paVar10;
      }
      local_b8._8_8_ = plVar8[1];
      *plVar8 = (long)paVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      std::runtime_error::runtime_error(this_00,(string *)&local_b8.field_1);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    __return_storage_ptr__->size_active = 0;
    __return_storage_ptr__->size_alloced = 0;
    __return_storage_ptr__->items = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
    this_01 = (XMLLoader *)xml->ptr;
    if ((_Base_ptr)(this_01->id2node)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
        (this_01->id2node)._M_t._M_impl.super__Rb_tree_header._M_header._M_right) {
      ptr = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      uVar9 = 0;
      uVar11 = 0;
    }
    else {
      uVar9 = 0;
      ptr = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)0x0;
      uVar12 = 0;
      do {
        XML::child((XML *)&local_d8,(size_t)this_01);
        loadQuaternion((AffineSpace3ff *)&local_b8.field_1,this_01,(Ref<embree::XML> *)&local_d8);
        uVar11 = uVar9;
        if (uVar9 <= uVar12) {
          if (uVar9 == 0) {
            uVar11 = uVar12 + 1;
          }
          else {
            do {
              uVar11 = uVar11 * 2 + (ulong)(uVar11 * 2 == 0);
            } while (uVar11 <= uVar12);
          }
        }
        local_48 = (pointer)local_b8._0_8_;
        pTStack_40 = (pointer)local_b8._8_8_;
        local_58 = (pointer)local_a8._0_8_;
        pRStack_50 = (pointer)local_a8._8_8_;
        local_68 = (_Base_ptr)local_98._M_allocated_capacity;
        sStack_60 = local_98._8_8_;
        local_78 = local_88;
        uStack_70 = p_Stack_80;
        if (uVar9 != uVar11) {
          pAVar6 = (AffineSpaceT<embree::LinearSpace3<embree::Vec3fx>_> *)
                   alignedMalloc(uVar11 << 6,0x10);
          if (uVar12 != 0) {
            lVar7 = 0x30;
            uVar9 = uVar12;
            do {
              puVar1 = (undefined8 *)((long)ptr + lVar7 + -0x30);
              uVar4 = puVar1[1];
              puVar2 = (undefined8 *)((long)pAVar6 + lVar7 + -0x30);
              *puVar2 = *puVar1;
              puVar2[1] = uVar4;
              puVar1 = (undefined8 *)((long)ptr + lVar7 + -0x20);
              uVar4 = puVar1[1];
              puVar2 = (undefined8 *)((long)pAVar6 + lVar7 + -0x20);
              *puVar2 = *puVar1;
              puVar2[1] = uVar4;
              puVar1 = (undefined8 *)((long)ptr + lVar7 + -0x10);
              uVar4 = puVar1[1];
              puVar2 = (undefined8 *)((long)pAVar6 + lVar7 + -0x10);
              *puVar2 = *puVar1;
              puVar2[1] = uVar4;
              puVar1 = (undefined8 *)((long)&(ptr->l).vx.field_0 + lVar7);
              uVar4 = puVar1[1];
              puVar2 = (undefined8 *)((long)&(pAVar6->l).vx.field_0 + lVar7);
              *puVar2 = *puVar1;
              puVar2[1] = uVar4;
              lVar7 = lVar7 + 0x40;
              uVar9 = uVar9 - 1;
            } while (uVar9 != 0);
          }
          alignedFree(ptr);
          uVar9 = uVar11;
          ptr = pAVar6;
        }
        uVar11 = uVar12 + 1;
        *(pointer *)&ptr[uVar12].l.vx.field_0 = local_48;
        *(pointer *)((long)&ptr[uVar12].l.vx.field_0 + 8) = pTStack_40;
        pVVar3 = &ptr[uVar12].l.vy;
        *(pointer *)&pVVar3->field_0 = local_58;
        *(pointer *)((long)&pVVar3->field_0 + 8) = pRStack_50;
        pVVar3 = &ptr[uVar12].l.vz;
        *(_Base_ptr *)&pVVar3->field_0 = local_68;
        *(size_t *)((long)&pVVar3->field_0 + 8) = sStack_60;
        pVVar3 = &ptr[uVar12].p;
        (pVVar3->field_0).m128[0] = (float)local_78;
        (pVVar3->field_0).m128[1] = local_78._4_4_;
        (pVVar3->field_0).m128[2] = (float)uStack_70;
        (pVVar3->field_0).m128[3] = uStack_70._4_4_;
        if ((_func_int **)local_d8._M_dataplus._M_p != (_func_int **)0x0) {
          (**(code **)(*(_func_int **)local_d8._M_dataplus._M_p + 0x18))();
        }
        this_01 = (XMLLoader *)xml->ptr;
        uVar12 = uVar11;
      } while (uVar11 < (ulong)((long)((this_01->id2node)._M_t._M_impl.super__Rb_tree_header.
                                       _M_node_count -
                                      (long)(this_01->id2node)._M_t._M_impl.super__Rb_tree_header.
                                            _M_header._M_right) >> 3));
    }
    __return_storage_ptr__->size_active = uVar11;
    __return_storage_ptr__->size_alloced = uVar9;
    __return_storage_ptr__->items = ptr;
  }
  return __return_storage_ptr__;
}

Assistant:

avector<AffineSpace3ff> XMLLoader::loadQuaternionArray(const Ref<XML>& xml)
  {
    if (!xml) return avector<AffineSpace3ff>();

    if (xml->name == "QuaternionArray") {
      avector<AffineSpace3ff> spaceArray;
      for (size_t i = 0; i < xml->size(); ++i) {
        auto child = xml->child(i);
        spaceArray.push_back(loadQuaternion(child));
      }
      return spaceArray;
    }
    else
      THROW_RUNTIME_ERROR(xml->loc.str()+": invalid Quaternion array");
  }